

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTypes.h
# Opt level: O3

int glslang::getTypeRank(TBasicType type)

{
  if (type - EbtInt8 < 8) {
    return *(int *)(&DAT_00888c7c + (ulong)(type - EbtInt8) * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/../Include/BaseTypes.h"
                ,0x290,"int glslang::getTypeRank(TBasicType)");
}

Assistant:

__inline int getTypeRank(TBasicType type)
{
    int res = -1;
    switch(type) {
    case EbtInt8:
    case EbtUint8:
        res = 0;
        break;
    case EbtInt16:
    case EbtUint16:
        res = 1;
        break;
    case EbtInt:
    case EbtUint:
        res = 2;
        break;
    case EbtInt64:
    case EbtUint64:
        res = 3;
        break;
    default:
        assert(false);
        break;
    }
    return res;
}